

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
imrt::Station::getClosed
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Station *this,int beam)

{
  iterator __position;
  bool bVar1;
  int local_24;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_24 = 0;
  if (0 < this->max_apertures) {
    do {
      bVar1 = isOpenBeamlet(this,beam,local_24);
      if (!bVar1) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_24)
          ;
        }
        else {
          *__position._M_current = local_24;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_24 = local_24 + 1;
    } while (local_24 < this->max_apertures);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Station::getClosed(int beam) {
    vector<int> closed;
    for (int i =0;i<max_apertures;i++){
      if (!isOpenBeamlet(beam,i)) closed.push_back(i);
    }
    return(closed);
  }